

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t cleanup_pathname(archive_write_disk *a)

{
  bool bVar1;
  char local_29;
  char *pcStack_28;
  char separator;
  char *src;
  char *dest;
  archive_write_disk *a_local;
  
  local_29 = '\0';
  src = a->name;
  if (*src == '\0') {
    archive_set_error(&a->archive,-1,"Invalid empty pathname");
    return L'\xffffffe7';
  }
  pcStack_28 = src;
  if (*src == '/') {
    if ((a->flags & 0x10000U) != 0) {
      archive_set_error(&a->archive,-1,"Path is absolute");
      return L'\xffffffe7';
    }
    pcStack_28 = src + 1;
    local_29 = *src;
  }
  while (*pcStack_28 != '\0') {
    if (*pcStack_28 == '/') {
      pcStack_28 = pcStack_28 + 1;
    }
    else if (*pcStack_28 == '.') {
      if (pcStack_28[1] == '\0') break;
      if (pcStack_28[1] != '/') {
        if ((pcStack_28[1] == '.') &&
           (((pcStack_28[2] == '/' || (pcStack_28[2] == '\0')) && ((a->flags & 0x200U) != 0)))) {
          archive_set_error(&a->archive,-1,"Path contains \'..\'");
          return L'\xffffffe7';
        }
        goto LAB_001fa16f;
      }
      pcStack_28 = pcStack_28 + 2;
    }
    else {
LAB_001fa16f:
      if (local_29 != '\0') {
        *src = '/';
        src = src + 1;
      }
      while( true ) {
        bVar1 = false;
        if (*pcStack_28 != '\0') {
          bVar1 = *pcStack_28 != '/';
        }
        if (!bVar1) break;
        *src = *pcStack_28;
        pcStack_28 = pcStack_28 + 1;
        src = src + 1;
      }
      if (*pcStack_28 == '\0') break;
      local_29 = *pcStack_28;
      pcStack_28 = pcStack_28 + 1;
    }
  }
  if (src == a->name) {
    if (local_29 == '\0') {
      *src = '.';
    }
    else {
      *src = '/';
    }
    src = src + 1;
  }
  *src = '\0';
  return L'\0';
}

Assistant:

static int
cleanup_pathname(struct archive_write_disk *a)
{
	char *dest, *src;
	char separator = '\0';

	dest = src = a->name;
	if (*src == '\0') {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid empty pathname");
		return (ARCHIVE_FAILED);
	}

#if defined(__CYGWIN__)
	cleanup_pathname_win(a);
#endif
	/* Skip leading '/'. */
	if (*src == '/') {
		if (a->flags & ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			                  "Path is absolute");
			return (ARCHIVE_FAILED);
		}

		separator = *src++;
	}

	/* Scan the pathname one element at a time. */
	for (;;) {
		/* src points to first char after '/' */
		if (src[0] == '\0') {
			break;
		} else if (src[0] == '/') {
			/* Found '//', ignore second one. */
			src++;
			continue;
		} else if (src[0] == '.') {
			if (src[1] == '\0') {
				/* Ignore trailing '.' */
				break;
			} else if (src[1] == '/') {
				/* Skip './'. */
				src += 2;
				continue;
			} else if (src[1] == '.') {
				if (src[2] == '/' || src[2] == '\0') {
					/* Conditionally warn about '..' */
					if (a->flags & ARCHIVE_EXTRACT_SECURE_NODOTDOT) {
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_MISC,
						    "Path contains '..'");
						return (ARCHIVE_FAILED);
					}
				}
				/*
				 * Note: Under no circumstances do we
				 * remove '..' elements.  In
				 * particular, restoring
				 * '/foo/../bar/' should create the
				 * 'foo' dir as a side-effect.
				 */
			}
		}

		/* Copy current element, including leading '/'. */
		if (separator)
			*dest++ = '/';
		while (*src != '\0' && *src != '/') {
			*dest++ = *src++;
		}

		if (*src == '\0')
			break;

		/* Skip '/' separator. */
		separator = *src++;
	}
	/*
	 * We've just copied zero or more path elements, not including the
	 * final '/'.
	 */
	if (dest == a->name) {
		/*
		 * Nothing got copied.  The path must have been something
		 * like '.' or '/' or './' or '/././././/./'.
		 */
		if (separator)
			*dest++ = '/';
		else
			*dest++ = '.';
	}
	/* Terminate the result. */
	*dest = '\0';
	return (ARCHIVE_OK);
}